

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall
Variable_removeIndirectEquivalence_Test::~Variable_removeIndirectEquivalence_Test
          (Variable_removeIndirectEquivalence_Test *this)

{
  Variable_removeIndirectEquivalence_Test *this_local;
  
  ~Variable_removeIndirectEquivalence_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Variable, removeIndirectEquivalence)
{
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr comp1 = libcellml::Component::create();

    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::VariablePtr v3 = libcellml::Variable::create();

    m->setName("modelName");
    comp1->setName("component1");

    v1->setName("variable1");
    v2->setName("variable2");
    v3->setName("variable3");

    v1->setUnits("dimensionless");
    v2->setUnits("dimensionless");
    v3->setUnits("dimensionless");

    comp1->addVariable(v1);
    comp1->addVariable(v2);
    comp1->addVariable(v3);
    m->addComponent(comp1);

    EXPECT_TRUE(v1->hasParent());
    EXPECT_TRUE(v2->hasParent());
    EXPECT_TRUE(v3->hasParent());

    // Make v1=v2=v3
    libcellml::Variable::addEquivalence(v2, v3);
    libcellml::Variable::addEquivalence(v1, v3);

    // All variables connected ...
    EXPECT_TRUE(v1->hasEquivalentVariable(v2, true));
    EXPECT_TRUE(v2->hasEquivalentVariable(v3, true));
    EXPECT_TRUE(v1->hasEquivalentVariable(v3, true));

    // ... but not directly through v1-v2
    EXPECT_FALSE(v1->hasEquivalentVariable(v2));
    EXPECT_TRUE(v1->hasEquivalentVariable(v3));
    EXPECT_TRUE(v2->hasEquivalentVariable(v3));

    // Attempt to remove v1=v2
    EXPECT_FALSE(libcellml::Variable::removeEquivalence(v1, v2));

    // But cannot remove indirect equivalence
    EXPECT_TRUE(v1->hasEquivalentVariable(v2, true));
    EXPECT_FALSE(v1->hasEquivalentVariable(v2)); // It never was anyway, no change here

    // Nothing else should have changed here
    EXPECT_TRUE(v1->hasEquivalentVariable(v3, true));
    EXPECT_TRUE(v2->hasEquivalentVariable(v3, true));
    EXPECT_TRUE(v1->hasEquivalentVariable(v3));
    EXPECT_TRUE(v2->hasEquivalentVariable(v3));
}